

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

int * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Insert
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key,int *value)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_c;
  
  local_c = (FName)key->Index;
  pNVar1 = this->Nodes + (this->Size - 1 & local_c.Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == local_c.Index) {
LAB_0039e978:
      (pNVar2->Pair).Value = *value;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = NewKey(this,&local_c);
  goto LAB_0039e978;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}